

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void statement(object *proc,int retSize)

{
  bool bVar1;
  int iVar2;
  item *x_00;
  item *x_01;
  object *y_00;
  typeDesc *ptVar3;
  int local_50;
  int jumpTo;
  int cond;
  typeDesc *type;
  object *par;
  object *procObj;
  object *obj;
  item *y;
  item *x;
  int retSize_local;
  object *proc_local;
  
  bVar1 = true;
  x_00 = (item *)calloc(1,0x30);
  x_01 = (item *)calloc(1,0x30);
  if (currentSymbol == 0x1f5) {
    y_00 = find();
    getSymbol();
    makeItem(x_00,y_00);
    selector(x_00);
    if (currentSymbol == 0x65) {
      getSymbol();
      if (currentSymbol == 0x1f8) {
        simpleExpression(x_01);
        store(x_00,x_01);
      }
      else if (currentSymbol == 0x26a) {
        ptVar3 = getType(x_00->typeIndex);
        if (ptVar3->form != 0x324) {
          mark("incompatible NULL pointer assignment");
          exit(-1);
        }
        if (x_00->mode == 0x2c1) {
          if (x_00->lev == 0) {
            x_00->a = RISC_MEMSIZE + x_00->a;
          }
          put(0x24,0,x_00->r,x_00->a);
        }
        else {
          if (x_00->mode != 0x2c6) {
            mark("incompatible NULL pointer assignment");
            exit(-1);
          }
          put(0x34,0,x_00->r,x_00->a);
        }
        regs[x_00->r] = 0;
        getSymbol();
      }
      else {
        expression(x_01);
        store(x_00,x_01);
      }
      semicolon();
    }
    else if (x_00->mode == 0x2c0) {
      if (y_00->val < 0) {
        type = (typeDesc *)y_00->dsc->next;
      }
      else {
        type = (typeDesc *)y_00->dsc;
      }
      if (currentSymbol == 0x12d) {
        getSymbol();
        if (currentSymbol == 0x12e) {
          getSymbol();
        }
        else {
          type = (typeDesc *)parameter((object *)type);
          while (bVar1) {
            if (currentSymbol == 0xcc) {
              getSymbol();
            }
            else if (currentSymbol == 0x12e) {
              getSymbol();
              bVar1 = false;
            }
            if (bVar1) {
              type = (typeDesc *)parameter((object *)type);
            }
          }
        }
      }
      semicolon();
      iVar2 = isParameter((object *)type);
      if (iVar2 == 1) {
        mark("too few parameters");
        exit(-1);
      }
      if (y_00->val < 0) {
        addProcToFixList(pc,y_00);
        local_50 = 0;
      }
      else {
        local_50 = x_00->a - pc;
      }
      call(x_00,local_50);
    }
    else if (x_00->mode == 0x2c4) {
      param(x_01);
      if (y_00->val < 7) {
        IOCall(x_00,x_01);
      }
      semicolon();
    }
  }
  else if (currentSymbol == 0x259) {
    getSymbol();
    iterationStatement(proc,retSize);
  }
  else if (currentSymbol == 0x25a) {
    getSymbol();
    conditionalBranchStatement(proc,retSize);
  }
  else if (currentSymbol == 0x25d) {
    getSymbol();
    returnStatement(proc,retSize);
  }
  else if (currentSymbol == 0x26b) {
    getSymbol();
    allocStatement();
  }
  else {
    if (currentSymbol != 0x26e) {
      mark("unknown statement");
      exit(-1);
    }
    getSymbol();
    exitStatement();
  }
  return;
}

Assistant:

procedure 
void statement(struct object *proc, int retSize)  {
	variable struct item *x; variable struct item *y;
	variable struct object *obj; variable struct object *procObj; variable struct object *par;
	variable struct typeDesc *type;
	variable bool cond; variable int jumpTo;
	x = NULL; y = NULL; obj = NULL; par = NULL; type = NULL; procObj = NULL; jumpTo = 0;
	cond = true;
	allocMem(x); allocMem(y);	
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		obj = find();
		getSymbol();
		makeItem(x,obj);
		selector(x);
		if (currentSymbol == SYMBOL_ASSIGN) {
			getSymbol();
			if (currentSymbol == SYMBOL_CHARACTERLITERAL) {
				simpleExpression(y);
				store(x,y);
			} elsif (currentSymbol == SYMBOL_NULL) {
				type = getType(x->typeIndex);
				if (type->form == FORM_REF) {
					if (x->mode == CLASS_VAR) {
						if (x->lev == 0) {
							x->a = RISC_MEMSIZE + x->a;
						}
						put(RISC_STW,0,x->r,x->a);
					} elsif (x->mode == CLASS_IND) { 
						put(RISC_HSTW,0,x->r,x->a);
					} else {
						mark("incompatible NULL pointer assignment");
						exit(-1);
					}
					regs[x->r] = 0; /* free x->r */
				} else {
					mark("incompatible NULL pointer assignment");
					exit(-1);
				}
				getSymbol();
			} else 	{
				expression(y);
				store(x,y);
			}
			semicolon();
		} elsif (x->mode == CLASS_PROC) { 
			procObj = obj;
			if (procObj->val < 0) { /* prototype => dsc still points to head for further use */
				par = obj->dsc->next;
			} else {
				par = obj->dsc;
			}
			if (currentSymbol == SYMBOL_LPARAN) { 
				getSymbol(); 
				if (currentSymbol == SYMBOL_RPARAN) {
					getSymbol();
				} else {
					par = parameter(par);
					while (cond == true) {
						if (currentSymbol == SYMBOL_COMMA) {
							getSymbol();
						} elsif (currentSymbol == SYMBOL_RPARAN) {
							getSymbol();
							cond = false;
						}
						if (cond == true) {
							par = parameter(par);
						}
					}
				}
			}
			semicolon();
			if (isParameter(par) != true) {
				if (procObj->val < 0) { /* only prototype exists till now */
					addProcToFixList(pc,procObj);
					jumpTo = 0;
				} else {
					jumpTo = x->a - pc;
				}
				call(x,jumpTo);
			} else {
				mark("too few parameters");
				exit(-1);
			}
		} elsif (x->mode == CLASS_SPROC) { 
			param(y);
			if (obj->val <= 6) {
				IOCall(x,y);
			}
			semicolon();
		}
	}